

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_vector.h
# Opt level: O2

void crnlib::vector<crnlib::alpha_selector_details>::object_mover
               (void *pDst_void,void *pSrc_void,uint num)

{
  long lVar1;
  
  for (lVar1 = 0; (ulong)num * 0x204 - lVar1 != 0; lVar1 = lVar1 + 0x204) {
    memcpy((void *)((long)pDst_void + lVar1),(void *)((long)pSrc_void + lVar1),0x204);
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint num)
        {
            T* pSrc = static_cast<T*>(pSrc_void);
            T* const pSrc_end = pSrc + num;
            T* pDst = static_cast<T*>(pDst_void);

            while (pSrc != pSrc_end)
            {
                // placement new
                new (static_cast<void*>(pDst)) T(*pSrc);
                pSrc->~T();
                ++pSrc;
                ++pDst;
            }
        }